

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O1

string * directories::MADPGetResultsDir_abi_cxx11_(void)

{
  string *in_RDI;
  wordexp_t p;
  allocator<char> local_29;
  wordexp_t local_28;
  
  wordexp("~/.madp/results",&local_28,0);
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,*local_28.we_wordv,&local_29);
  wordfree(&local_28);
  return in_RDI;
}

Assistant:

string directories::MADPGetResultsDir()
{
    wordexp_t p;
    wordexp("~/.madp/results",&p,0);
    string dir(p.we_wordv[0]);
    wordfree(&p);
    return(dir);
}